

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::Synth(Synth *this,ReportHandler *useReportHandler)

{
  MemParams *pMVar1;
  Extensions *this_00;
  ReportHandler2 *local_38;
  int local_1c;
  int i;
  ReportHandler *useReportHandler_local;
  Synth *this_local;
  
  pMVar1 = (MemParams *)operator_new(0x10dab);
  this->mt32ram = pMVar1;
  pMVar1 = (MemParams *)operator_new(0x10dab);
  this->mt32default = pMVar1;
  this_00 = (Extensions *)operator_new(0xd0);
  Extensions::Extensions(this_00);
  this->extensions = this_00;
  this->opened = false;
  this->reverbOverridden = false;
  this->partialCount = 0x20;
  this->controlROMMap = (ControlROMMap *)0x0;
  this->controlROMFeatures = (ControlROMFeatureSet *)0x0;
  local_38 = (ReportHandler2 *)useReportHandler;
  if (useReportHandler == (ReportHandler *)0x0) {
    local_38 = &this->extensions->defaultReportHandler;
  }
  this->reportHandler = &local_38->super_ReportHandler;
  this->extensions->reportHandler2 = &this->extensions->defaultReportHandler;
  this->extensions->preallocatedReverbMemory = false;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    this->reverbModels[local_1c] = (BReverbModel *)0x0;
  }
  this->reverbModel = (BReverbModel *)0x0;
  this->analog = (Analog *)0x0;
  this->renderer = (Renderer *)0x0;
  setDACInputMode(this,DACInputMode_NICE);
  setMIDIDelayMode(this,MIDIDelayMode_DELAY_SHORT_MESSAGES_ONLY);
  setOutputGain(this,1.0);
  setReverbOutputGain(this,1.0);
  setReversedStereoEnabled(this,false);
  setNiceAmpRampEnabled(this,true);
  setNicePanningEnabled(this,false);
  setNicePartialMixingEnabled(this,false);
  selectRendererType(this,RendererType_BIT16S);
  this->patchTempMemoryRegion = (PatchTempMemoryRegion *)0x0;
  this->rhythmTempMemoryRegion = (RhythmTempMemoryRegion *)0x0;
  this->timbreTempMemoryRegion = (TimbreTempMemoryRegion *)0x0;
  this->patchesMemoryRegion = (PatchesMemoryRegion *)0x0;
  this->timbresMemoryRegion = (TimbresMemoryRegion *)0x0;
  this->systemMemoryRegion = (SystemMemoryRegion *)0x0;
  this->displayMemoryRegion = (DisplayMemoryRegion *)0x0;
  this->resetMemoryRegion = (ResetMemoryRegion *)0x0;
  this->paddedTimbreMaxTable = (Bit8u *)0x0;
  this->partialManager = (PartialManager *)0x0;
  this->pcmWaves = (PCMWaveEntry *)0x0;
  this->pcmROMData = (Bit16s *)0x0;
  this->soundGroupNames = (char (*) [9])0x0;
  this->midiQueue = (MidiEventQueue *)0x0;
  this->extensions->midiEventQueueSize = 0x400;
  this->extensions->midiEventQueueSysexStorageBufferSize = 0;
  this->lastReceivedMIDIEventTimestamp = 0;
  memset(this->parts,0,0x48);
  this->renderedSampleCount = 0;
  this->extensions->display = (Display *)0x0;
  this->extensions->oldMT32DisplayFeatures = false;
  return;
}

Assistant:

Synth::Synth(ReportHandler *useReportHandler) :
	mt32ram(*new MemParams),
	mt32default(*new MemParams),
	extensions(*new Extensions)
{
	opened = false;
	reverbOverridden = false;
	partialCount = DEFAULT_MAX_PARTIALS;
	controlROMMap = NULL;
	controlROMFeatures = NULL;

	reportHandler = useReportHandler != NULL ? useReportHandler : &extensions.defaultReportHandler;
	extensions.reportHandler2 = &extensions.defaultReportHandler;

	extensions.preallocatedReverbMemory = false;
	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		reverbModels[i] = NULL;
	}
	reverbModel = NULL;
	analog = NULL;
	renderer = NULL;
	setDACInputMode(DACInputMode_NICE);
	setMIDIDelayMode(MIDIDelayMode_DELAY_SHORT_MESSAGES_ONLY);
	setOutputGain(1.0f);
	setReverbOutputGain(1.0f);
	setReversedStereoEnabled(false);
	setNiceAmpRampEnabled(true);
	setNicePanningEnabled(false);
	setNicePartialMixingEnabled(false);
	selectRendererType(RendererType_BIT16S);

	patchTempMemoryRegion = NULL;
	rhythmTempMemoryRegion = NULL;
	timbreTempMemoryRegion = NULL;
	patchesMemoryRegion = NULL;
	timbresMemoryRegion = NULL;
	systemMemoryRegion = NULL;
	displayMemoryRegion = NULL;
	resetMemoryRegion = NULL;
	paddedTimbreMaxTable = NULL;

	partialManager = NULL;
	pcmWaves = NULL;
	pcmROMData = NULL;
	soundGroupNames = NULL;
	midiQueue = NULL;
	extensions.midiEventQueueSize = DEFAULT_MIDI_EVENT_QUEUE_SIZE;
	extensions.midiEventQueueSysexStorageBufferSize = 0;
	lastReceivedMIDIEventTimestamp = 0;
	memset(parts, 0, sizeof(parts));
	renderedSampleCount = 0;
	extensions.display = NULL;
	extensions.oldMT32DisplayFeatures = false;
}